

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::VisitEntry(cmComputeLinkDepends *this,int index)

{
  _Base_ptr *this_00;
  _Rb_tree_header *p_Var1;
  uint component;
  int iVar2;
  iterator __position;
  pointer piVar3;
  pointer pcVar4;
  int *piVar5;
  pointer pcVar6;
  pointer pcVar7;
  PendingComponent *pPVar8;
  int *piVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  cmGraphEdge *oi;
  pointer pcVar12;
  const_iterator __position_00;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar13;
  _Alloc_node __an;
  int local_34;
  _Alloc_node local_30;
  
  __position._M_current =
       (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_34 = index;
  if (__position._M_current ==
      (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->FinalLinkOrder,__position,&local_34);
  }
  else {
    *__position._M_current = index;
    (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  component = (this->CCG->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_34];
  piVar3 = (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var11 = (this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->PendingComponents)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = &p_Var1->_M_header;
  if (p_Var11 != (_Base_ptr)0x0) {
    iVar2 = piVar3[(int)component];
    do {
      if (iVar2 <= (int)p_Var11[1]._M_color) {
        p_Var10 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < iVar2];
    } while (p_Var11 != (_Base_ptr)0x0);
  }
  __position_00._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
     (__position_00._M_node = p_Var10, piVar3[(int)component] < (int)p_Var10[1]._M_color)) {
    __position_00._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position_00._M_node == p_Var1) {
    pcVar4 = (this->CCG->Components).
             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (4 < (ulong)((long)*(pointer *)
                           ((long)&pcVar4[(int)component].super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                   *(long *)&pcVar4[(int)component].super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl)) {
      pPVar8 = MakePendingComponent(this,component);
      pVar13 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range(&(pPVar8->Entries)._M_t,&local_34);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(&(pPVar8->Entries)._M_t,(_Base_ptr)pVar13.first._M_node,
                   (_Base_ptr)pVar13.second._M_node);
      return;
    }
  }
  else {
    this_00 = &__position_00._M_node[1]._M_left;
    pVar13 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
             equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          *)this_00,&local_34);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               this_00,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    if (__position_00._M_node[2]._M_right != (_Base_ptr)0x0) {
      return;
    }
    piVar9 = (int *)((long)&__position_00._M_node[1]._M_parent + 4);
    *piVar9 = *piVar9 + -1;
    if (*piVar9 != 0) {
      pcVar4 = (this->CCG->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = *(int **)&pcVar4[(int)component].super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      piVar5 = *(pointer *)
                ((long)&pcVar4[(int)component].super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
      if ((ulong)((long)piVar5 - (long)piVar9) < 5) {
        __assert_fail("nl.size() > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmComputeLinkDepends.cxx"
                      ,0x2e6,"void cmComputeLinkDepends::VisitEntry(int)");
      }
      if (piVar9 == piVar5) {
        return;
      }
      local_30._M_t =
           (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)this_00;
      do {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   this_00,(const_iterator)&__position_00._M_node[1]._M_right,piVar9,&local_30);
        piVar9 = piVar9 + 1;
      } while (piVar9 != piVar5);
      return;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::PendingComponent>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
    ::_M_erase_aux(&(this->PendingComponents)._M_t,__position_00);
  }
  pcVar6 = (this->CCG->ComponentGraph).
           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar7 = *(pointer *)
            ((long)&pcVar6[(int)component].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
  for (pcVar12 = *(pointer *)
                  &pcVar6[(int)component].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                   super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>; pcVar12 != pcVar7;
      pcVar12 = pcVar12 + 1) {
    MakePendingComponent(this,pcVar12->Dest);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::VisitEntry(int index)
{
  // Include this entry on the link line.
  this->FinalLinkOrder.push_back(index);

  // This entry has now been seen.  Update its component.
  bool completed = false;
  int component = this->CCG->GetComponentMap()[index];
  std::map<int, PendingComponent>::iterator mi =
    this->PendingComponents.find(this->ComponentOrder[component]);
  if (mi != this->PendingComponents.end()) {
    // The entry is in an already pending component.
    PendingComponent& pc = mi->second;

    // Remove the entry from those pending in its component.
    pc.Entries.erase(index);
    if (pc.Entries.empty()) {
      // The complete component has been seen since it was last needed.
      --pc.Count;

      if (pc.Count == 0) {
        // The component has been completed.
        this->PendingComponents.erase(mi);
        completed = true;
      } else {
        // The whole component needs to be seen again.
        NodeList const& nl = this->CCG->GetComponent(component);
        assert(nl.size() > 1);
        pc.Entries.insert(nl.begin(), nl.end());
      }
    }
  } else {
    // The entry is not in an already pending component.
    NodeList const& nl = this->CCG->GetComponent(component);
    if (nl.size() > 1) {
      // This is a non-trivial component.  It is now pending.
      PendingComponent& pc = this->MakePendingComponent(component);

      // The starting entry has already been seen.
      pc.Entries.erase(index);
    } else {
      // This is a trivial component, so it is already complete.
      completed = true;
    }
  }

  // If the entry completed a component, the component's dependencies
  // are now pending.
  if (completed) {
    EdgeList const& ol = this->CCG->GetComponentGraphEdges(component);
    for (cmGraphEdge const& oi : ol) {
      // This entire component is now pending no matter whether it has
      // been partially seen already.
      this->MakePendingComponent(oi);
    }
  }
}